

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tctok.cpp
# Opt level: O3

tc_toktyp_t __thiscall
CTcTokenizer::next_on_line_xlat(CTcTokenizer *this,utf8_ptr *p,CTcToken *tok,tok_embed_ctx *ec)

{
  wchar_t wVar1;
  tc_toktyp_t tVar2;
  
  skip_ws_and_markers(p);
  wVar1 = utf8_ptr::s_getch(p->p_);
  if (wVar1 < L'>') {
    if ((wVar1 == L'\"') || (wVar1 == L'\'')) {
      tVar2 = xlat_string_to(this,p->p_ + 1,p,tok,ec,0);
      return tVar2;
    }
  }
  else if (wVar1 == L'>') {
    if ((((ec != (tok_embed_ctx *)0x0) && (ec->level != 0)) && (ec->s->parens == 0)) &&
       (wVar1 = utf8_ptr::s_getch_at(p->p_,1), wVar1 == L'>')) goto LAB_0021a6bb;
  }
  else if ((wVar1 == L'R') &&
          ((wVar1 = utf8_ptr::s_getch_at(p->p_,1), wVar1 == L'\"' ||
           (wVar1 = utf8_ptr::s_getch_at(p->p_,1), wVar1 == L'\'')))) {
LAB_0021a6bb:
    tVar2 = tokenize_string(p,tok,ec,0);
    return tVar2;
  }
  tVar2 = next_on_line(p,tok,ec,0);
  return tVar2;
}

Assistant:

tc_toktyp_t CTcTokenizer::next_on_line_xlat(utf8_ptr *p, CTcToken *tok,
                                            tok_embed_ctx *ec)
{
    /* skip whitespace */
    skip_ws_and_markers(p);

    /* if this is a string, translate escapes */
    switch(p->getch())
    {
    case '"':
    case '\'':
        /* translate the string */
        return xlat_string(p, tok, ec);

    case '>':
        /* if we're in an embedding, check for '>>' */
        if (ec != 0 && ec->in_expr()
            && ec->parens() == 0
            && p->getch_at(1) == '>')
            return tokenize_string(p, tok, ec, FALSE);

        /* use the default case */
        goto do_normal;

    case 'R':
        /* check for a regex string */
        if (p->getch_at(1) == '"' || p->getch_at(1) == '\'')
            return tokenize_string(p, tok, ec, FALSE);

        /* not a regex string - fall through to the default handling */
        
    default:
    do_normal:
        /* for anything else, use the default tokenizer */
        return next_on_line(p, tok, ec, FALSE);
    }
}